

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::CZString::operator<(CZString *this,CZString *other)

{
  int iVar1;
  uint *puVar2;
  undefined8 *in_RSI;
  long *in_RDI;
  int comp;
  uint min_len;
  uint other_len;
  uint this_len;
  uint local_20;
  uint local_1c;
  undefined8 *local_18;
  bool local_1;
  
  if (*in_RDI == 0) {
    local_1 = *(uint *)(in_RDI + 1) < *(uint *)(in_RSI + 1);
  }
  else {
    local_1c = *(uint *)(in_RDI + 1) >> 2;
    local_20 = *(uint *)(in_RSI + 1) >> 2;
    local_18 = in_RSI;
    puVar2 = std::min<unsigned_int>(&local_1c,&local_20);
    iVar1 = memcmp((void *)*in_RDI,(void *)*local_18,(ulong)*puVar2);
    if (iVar1 < 0) {
      local_1 = true;
    }
    else if (iVar1 < 1) {
      local_1 = local_1c < local_20;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Value::CZString::operator<(const CZString& other) const {
  if (!cstr_) return index_ < other.index_;
  //return strcmp(cstr_, other.cstr_) < 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  unsigned min_len = std::min(this_len, other_len);
  int comp = memcmp(this->cstr_, other.cstr_, min_len);
  if (comp < 0) return true;
  if (comp > 0) return false;
  return (this_len < other_len);
}